

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExpressionConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionConstraintSyntax,slang::syntax::ExpressionConstraintSyntax_const&>
          (BumpAllocator *this,ExpressionConstraintSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  Info *pIVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ExpressionConstraintSyntax *pEVar15;
  
  pEVar15 = (ExpressionConstraintSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConstraintItemSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConstraintItemSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->soft).kind;
  uVar8 = (args->soft).field_0x2;
  NVar9.raw = (args->soft).numFlags.raw;
  uVar10 = (args->soft).rawLen;
  pIVar3 = (args->soft).info;
  pEVar4 = (args->expr).ptr;
  TVar11 = (args->semi).kind;
  uVar12 = (args->semi).field_0x2;
  NVar13.raw = (args->semi).numFlags.raw;
  uVar14 = (args->semi).rawLen;
  pIVar5 = (args->semi).info;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.kind =
       (args->super_ConstraintItemSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar15->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar15->soft).kind = TVar7;
  (pEVar15->soft).field_0x2 = uVar8;
  (pEVar15->soft).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar15->soft).rawLen = uVar10;
  (pEVar15->soft).info = pIVar3;
  (pEVar15->expr).ptr = pEVar4;
  (pEVar15->semi).kind = TVar11;
  (pEVar15->semi).field_0x2 = uVar12;
  (pEVar15->semi).numFlags = (NumericTokenFlags)NVar13.raw;
  (pEVar15->semi).rawLen = uVar14;
  (pEVar15->semi).info = pIVar5;
  return pEVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }